

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

string * test_sprintf<>(string_view format)

{
  basic_string_view<char> *in_RDX;
  type *in_RDI;
  v5 local_18 [16];
  
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>>(in_RDI,local_18,in_RDX);
  return in_RDI;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}